

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteLoop<double,unsigned_short,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (double *ldata,unsigned_short *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  byte bVar1;
  bool bVar2;
  unsigned_short uVar3;
  ValidityMask *mask_00;
  void *dataptr_00;
  SelectionVector *in_RCX;
  double in_RDX;
  long in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  TemplatedValidityMask<unsigned_long> *in_R9;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  void *in_stack_ffffffffffffffa8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb0;
  ValidityMask *in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  double dVar4;
  undefined7 in_stack_ffffffffffffffc8;
  
  bVar1 = (byte)idx & 1;
  bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8);
  if (bVar2) {
    for (dVar4 = 0.0; (ulong)dVar4 < (ulong)in_RDX; dVar4 = (double)((long)dVar4 + 1)) {
      dataptr_00 = (void *)SelectionVector::get_index(in_RCX,(idx_t)dVar4);
      uVar3 = GenericUnaryWrapper::
              Operation<duckdb::VectorTryCastOperator<duckdb::NumericTryCast>,double,unsigned_short>
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(idx_t)dVar4,dataptr_00
                        );
      *(unsigned_short *)(in_RSI + (long)dVar4 * 2) = uVar3;
    }
  }
  else {
    for (dVar4 = 0.0; (ulong)dVar4 < (ulong)in_RDX; dVar4 = (double)((long)dVar4 + 1)) {
      mask_00 = (ValidityMask *)SelectionVector::get_index(in_RCX,(idx_t)dVar4);
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValidUnsafe
                        (in_R9,CONCAT17(bVar1,in_stack_ffffffffffffffc8));
      if (bVar2) {
        uVar3 = GenericUnaryWrapper::
                Operation<duckdb::VectorTryCastOperator<duckdb::NumericTryCast>,double,unsigned_short>
                          (dVar4,mask_00,(idx_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
        ;
        *(unsigned_short *)(in_RSI + (long)dVar4 * 2) = uVar3;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}